

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O3

void YM2612_Update(ym2612_ *YM2612,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  UINT32 UVar11;
  ulong uVar12;
  DEV_SMPL *local_78;
  DEV_SMPL *pDStack_70;
  uint local_64;
  channel_ *local_60;
  channel_ *local_58;
  channel_ *local_50;
  channel_ *local_48;
  channel_ *local_40;
  channel_ *local_38;
  
  local_38 = YM2612->CHANNEL;
  if (YM2612->CHANNEL[0].SLOT[0].Finc == -1) {
    CALC_FINC_CH(YM2612,local_38);
  }
  local_40 = YM2612->CHANNEL + 1;
  if (YM2612->CHANNEL[1].SLOT[0].Finc == -1) {
    CALC_FINC_CH(YM2612,local_40);
  }
  local_58 = YM2612->CHANNEL + 2;
  if (YM2612->CHANNEL[2].SLOT[0].Finc == -1) {
    if ((YM2612->Mode & 0x40) == 0) {
      CALC_FINC_CH(YM2612,local_58);
    }
    else {
      iVar5 = YM2612->CHANNEL[2].KC[2];
      YM2612->CHANNEL[2].SLOT[0].Finc =
           ((YM2612->FINC_TAB[YM2612->CHANNEL[2].FNUM[2]] >>
            (7U - (char)YM2612->CHANNEL[2].FOCT[2] & 0x1f)) + YM2612->CHANNEL[2].SLOT[0].DT[iVar5])
           * YM2612->CHANNEL[2].SLOT[0].MUL;
      iVar5 = iVar5 >> ((byte)YM2612->CHANNEL[2].SLOT[0].KSR_S & 0x1f);
      if (YM2612->CHANNEL[2].SLOT[0].KSR != iVar5) {
        YM2612->CHANNEL[2].SLOT[0].KSR = iVar5;
        piVar4 = YM2612->CHANNEL[2].SLOT[0].DR;
        iVar7 = YM2612->CHANNEL[2].SLOT[0].AR[iVar5];
        YM2612->CHANNEL[2].SLOT[0].EincA = iVar7;
        iVar1 = piVar4[iVar5];
        YM2612->CHANNEL[2].SLOT[0].EincD = iVar1;
        iVar2 = YM2612->CHANNEL[2].SLOT[0].SR[iVar5];
        YM2612->CHANNEL[2].SLOT[0].EincS = iVar2;
        iVar5 = YM2612->CHANNEL[2].SLOT[0].RR[iVar5];
        YM2612->CHANNEL[2].SLOT[0].EincR = iVar5;
        iVar3 = YM2612->CHANNEL[2].SLOT[0].Ecurp;
        if (((iVar3 == 0) || (iVar7 = iVar1, iVar3 == 1)) ||
           ((YM2612->CHANNEL[2].SLOT[0].Ecnt < 0x20000000 &&
            ((iVar7 = iVar2, iVar3 == 2 || (iVar7 = iVar5, iVar3 == 3)))))) {
          YM2612->CHANNEL[2].SLOT[0].Einc = iVar7;
        }
      }
      iVar5 = YM2612->CHANNEL[2].KC[3];
      YM2612->CHANNEL[2].SLOT[2].Finc =
           ((YM2612->FINC_TAB[YM2612->CHANNEL[2].FNUM[3]] >>
            (7U - (char)YM2612->CHANNEL[2].FOCT[3] & 0x1f)) + YM2612->CHANNEL[2].SLOT[2].DT[iVar5])
           * YM2612->CHANNEL[2].SLOT[2].MUL;
      iVar5 = iVar5 >> ((byte)YM2612->CHANNEL[2].SLOT[2].KSR_S & 0x1f);
      if (YM2612->CHANNEL[2].SLOT[2].KSR != iVar5) {
        YM2612->CHANNEL[2].SLOT[2].KSR = iVar5;
        piVar4 = YM2612->CHANNEL[2].SLOT[2].DR;
        iVar7 = YM2612->CHANNEL[2].SLOT[2].AR[iVar5];
        YM2612->CHANNEL[2].SLOT[2].EincA = iVar7;
        iVar1 = piVar4[iVar5];
        YM2612->CHANNEL[2].SLOT[2].EincD = iVar1;
        iVar2 = YM2612->CHANNEL[2].SLOT[2].SR[iVar5];
        YM2612->CHANNEL[2].SLOT[2].EincS = iVar2;
        iVar5 = YM2612->CHANNEL[2].SLOT[2].RR[iVar5];
        YM2612->CHANNEL[2].SLOT[2].EincR = iVar5;
        iVar3 = YM2612->CHANNEL[2].SLOT[2].Ecurp;
        if (((iVar3 == 0) || (iVar7 = iVar1, iVar3 == 1)) ||
           ((YM2612->CHANNEL[2].SLOT[2].Ecnt < 0x20000000 &&
            ((iVar7 = iVar2, iVar3 == 2 || (iVar7 = iVar5, iVar3 == 3)))))) {
          YM2612->CHANNEL[2].SLOT[2].Einc = iVar7;
        }
      }
      iVar5 = YM2612->CHANNEL[2].KC[1];
      YM2612->CHANNEL[2].SLOT[1].Finc =
           ((YM2612->FINC_TAB[YM2612->CHANNEL[2].FNUM[1]] >>
            (7U - (char)YM2612->CHANNEL[2].FOCT[1] & 0x1f)) + YM2612->CHANNEL[2].SLOT[1].DT[iVar5])
           * YM2612->CHANNEL[2].SLOT[1].MUL;
      iVar5 = iVar5 >> ((byte)YM2612->CHANNEL[2].SLOT[1].KSR_S & 0x1f);
      if (YM2612->CHANNEL[2].SLOT[1].KSR != iVar5) {
        YM2612->CHANNEL[2].SLOT[1].KSR = iVar5;
        piVar4 = YM2612->CHANNEL[2].SLOT[1].DR;
        iVar7 = YM2612->CHANNEL[2].SLOT[1].AR[iVar5];
        YM2612->CHANNEL[2].SLOT[1].EincA = iVar7;
        iVar1 = piVar4[iVar5];
        YM2612->CHANNEL[2].SLOT[1].EincD = iVar1;
        iVar2 = YM2612->CHANNEL[2].SLOT[1].SR[iVar5];
        YM2612->CHANNEL[2].SLOT[1].EincS = iVar2;
        iVar5 = YM2612->CHANNEL[2].SLOT[1].RR[iVar5];
        YM2612->CHANNEL[2].SLOT[1].EincR = iVar5;
        iVar3 = YM2612->CHANNEL[2].SLOT[1].Ecurp;
        if (((iVar3 == 0) || (iVar7 = iVar1, iVar3 == 1)) ||
           ((YM2612->CHANNEL[2].SLOT[1].Ecnt < 0x20000000 &&
            ((iVar7 = iVar2, iVar3 == 2 || (iVar7 = iVar5, iVar3 == 3)))))) {
          YM2612->CHANNEL[2].SLOT[1].Einc = iVar7;
        }
      }
      iVar5 = YM2612->CHANNEL[2].KC[0];
      YM2612->CHANNEL[2].SLOT[3].Finc =
           ((YM2612->FINC_TAB[YM2612->CHANNEL[2].FNUM[0]] >>
            (7U - (char)YM2612->CHANNEL[2].FOCT[0] & 0x1f)) + YM2612->CHANNEL[2].SLOT[3].DT[iVar5])
           * YM2612->CHANNEL[2].SLOT[3].MUL;
      iVar5 = iVar5 >> ((byte)YM2612->CHANNEL[2].SLOT[3].KSR_S & 0x1f);
      if (YM2612->CHANNEL[2].SLOT[3].KSR != iVar5) {
        YM2612->CHANNEL[2].SLOT[3].KSR = iVar5;
        piVar4 = YM2612->CHANNEL[2].SLOT[3].DR;
        iVar7 = YM2612->CHANNEL[2].SLOT[3].AR[iVar5];
        YM2612->CHANNEL[2].SLOT[3].EincA = iVar7;
        iVar1 = piVar4[iVar5];
        YM2612->CHANNEL[2].SLOT[3].EincD = iVar1;
        iVar2 = YM2612->CHANNEL[2].SLOT[3].SR[iVar5];
        YM2612->CHANNEL[2].SLOT[3].EincS = iVar2;
        iVar5 = YM2612->CHANNEL[2].SLOT[3].RR[iVar5];
        YM2612->CHANNEL[2].SLOT[3].EincR = iVar5;
        iVar3 = YM2612->CHANNEL[2].SLOT[3].Ecurp;
        if (((iVar3 == 0) || (iVar7 = iVar1, iVar3 == 1)) ||
           ((YM2612->CHANNEL[2].SLOT[3].Ecnt < 0x20000000 &&
            ((iVar7 = iVar2, iVar3 == 2 || (iVar7 = iVar5, iVar3 == 3)))))) {
          YM2612->CHANNEL[2].SLOT[3].Einc = iVar7;
        }
      }
    }
  }
  local_48 = YM2612->CHANNEL + 3;
  if (YM2612->CHANNEL[3].SLOT[0].Finc == -1) {
    CALC_FINC_CH(YM2612,local_48);
  }
  local_50 = YM2612->CHANNEL + 4;
  if (YM2612->CHANNEL[4].SLOT[0].Finc == -1) {
    CALC_FINC_CH(YM2612,local_50);
  }
  local_60 = YM2612->CHANNEL + 5;
  if (YM2612->CHANNEL[5].SLOT[0].Finc == -1) {
    CALC_FINC_CH(YM2612,local_60);
  }
  if (length != 0 && buf != (DEV_SMPL **)0x0) {
    uVar9 = ~YM2612->Inter_Step >> 10 & 0x10;
    local_78 = *buf;
    pDStack_70 = buf[1];
    do {
      uVar12 = 0x200;
      if (length < 0x200) {
        uVar12 = (ulong)length;
      }
      iVar5 = YM2612->LFOinc;
      UVar11 = (UINT32)uVar12;
      if (iVar5 != 0) {
        uVar6 = YM2612->LFOcnt;
        uVar8 = 0;
        do {
          uVar6 = uVar6 + iVar5;
          uVar10 = (ulong)(uVar6 >> 0x10 & 0xffc);
          YM2612->LFO_ENV_UP[uVar8] = *(int *)((long)LFO_ENV_TAB + uVar10);
          YM2612->LFO_FREQ_UP[uVar8] = *(int *)((long)LFO_FREQ_TAB + uVar10);
          uVar8 = uVar8 + 1;
        } while (uVar12 != uVar8);
        YM2612->LFOcnt = uVar6;
        uVar9 = uVar9 | 8;
      }
      local_64 = length;
      if (YM2612->CHANNEL[0].Mute == '\0') {
        (*UPDATE_CHAN[YM2612->CHANNEL[0].ALGO + uVar9])(YM2612,local_38,&local_78,UVar11);
      }
      if (YM2612->CHANNEL[1].Mute == '\0') {
        (*UPDATE_CHAN[YM2612->CHANNEL[1].ALGO + uVar9])(YM2612,local_40,&local_78,UVar11);
      }
      if (YM2612->CHANNEL[2].Mute == '\0') {
        (*UPDATE_CHAN[YM2612->CHANNEL[2].ALGO + uVar9])(YM2612,local_58,&local_78,UVar11);
      }
      if (YM2612->CHANNEL[3].Mute == '\0') {
        (*UPDATE_CHAN[YM2612->CHANNEL[3].ALGO + uVar9])(YM2612,local_48,&local_78,UVar11);
      }
      if (YM2612->CHANNEL[4].Mute == '\0') {
        (*UPDATE_CHAN[YM2612->CHANNEL[4].ALGO + uVar9])(YM2612,local_50,&local_78,UVar11);
      }
      if ((YM2612->CHANNEL[5].Mute == '\0') && (YM2612->DAC == '\0')) {
        (*UPDATE_CHAN[YM2612->CHANNEL[5].ALGO + uVar9])(YM2612,local_60,&local_78,UVar11);
      }
      local_78 = local_78 + uVar12;
      pDStack_70 = pDStack_70 + uVar12;
      length = local_64 - UVar11;
    } while (length != 0);
  }
  return;
}

Assistant:

void YM2612_Update(ym2612_ *YM2612, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i, j, algo_type;
  UINT32 proclen;
  DEV_SMPL *procbuf[2];

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nStarting generating sound...\n\n");
#endif

  // Mise à jour des pas des compteurs-fréquences s'ils ont été modifiés

  if (YM2612->CHANNEL[0].SLOT[0].Finc == -1)
    CALC_FINC_CH(YM2612, &YM2612->CHANNEL[0]);
  if (YM2612->CHANNEL[1].SLOT[0].Finc == -1)
    CALC_FINC_CH(YM2612, &YM2612->CHANNEL[1]);
  if (YM2612->CHANNEL[2].SLOT[0].Finc == -1)
  {
    if (YM2612->Mode & 0x40)
    {
      CALC_FINC_SL(&(YM2612->CHANNEL[2].SLOT[S0]),
        YM2612->FINC_TAB[YM2612->CHANNEL[2].FNUM[2]] >> (7 - YM2612->CHANNEL[2].FOCT[2]),
        YM2612->CHANNEL[2].KC[2]);
      CALC_FINC_SL(&(YM2612->CHANNEL[2].SLOT[S1]),
        YM2612->FINC_TAB[YM2612->CHANNEL[2].FNUM[3]] >> (7 - YM2612->CHANNEL[2].FOCT[3]),
        YM2612->CHANNEL[2].KC[3]);
      CALC_FINC_SL(&(YM2612->CHANNEL[2].SLOT[S2]),
        YM2612->FINC_TAB[YM2612->CHANNEL[2].FNUM[1]] >> (7 - YM2612->CHANNEL[2].FOCT[1]),
        YM2612->CHANNEL[2].KC[1]);
      CALC_FINC_SL(&(YM2612->CHANNEL[2].SLOT[S3]),
        YM2612->FINC_TAB[YM2612->CHANNEL[2].FNUM[0]] >> (7 - YM2612->CHANNEL[2].FOCT[0]),
        YM2612->CHANNEL[2].KC[0]);
    }
    else
    {
      CALC_FINC_CH(YM2612, &YM2612->CHANNEL[2]);
    }
  }
  if (YM2612->CHANNEL[3].SLOT[0].Finc == -1)
    CALC_FINC_CH(YM2612, &YM2612->CHANNEL[3]);
  if (YM2612->CHANNEL[4].SLOT[0].Finc == -1)
    CALC_FINC_CH(YM2612, &YM2612->CHANNEL[4]);
  if (YM2612->CHANNEL[5].SLOT[0].Finc == -1)
    CALC_FINC_CH(YM2612, &YM2612->CHANNEL[5]);

  if (YM2612->Inter_Step & 0x04000)
    algo_type = 0;
  else
    algo_type = 16;

  if (buf == NULL || !length)
    return;

  procbuf[0] = buf[0];
  procbuf[1] = buf[1];
  while (length > 0)
  {
    proclen = (length <= MAX_UPDATE_LENGTH) ? length : MAX_UPDATE_LENGTH;
    if (YM2612->LFOinc)
    {
      // Precalcul LFO wav

      for (i = 0; i < proclen; i++)
      {
        j = ((YM2612->LFOcnt += YM2612->LFOinc) >> LFO_LBITS) & LFO_MASK;

        YM2612->LFO_ENV_UP[i] = LFO_ENV_TAB[j];
        YM2612->LFO_FREQ_UP[i] = LFO_FREQ_TAB[j];

  #if YM_DEBUG_LEVEL > 3
        fprintf(debug_file, "LFO_ENV_UP[%d] = %d   LFO_FREQ_UP[%d] = %d\n", i, YM2612->LFO_ENV_UP[i], i, YM2612->LFO_FREQ_UP[i]);
  #endif
      }

      algo_type |= 8;
    }


    if (!YM2612->CHANNEL[0].Mute)
      UPDATE_CHAN[YM2612->CHANNEL[0].ALGO + algo_type](YM2612, &(YM2612->CHANNEL[0]), procbuf, proclen);
    if (!YM2612->CHANNEL[1].Mute)
      UPDATE_CHAN[YM2612->CHANNEL[1].ALGO + algo_type](YM2612, &(YM2612->CHANNEL[1]), procbuf, proclen);
    if (!YM2612->CHANNEL[2].Mute)
      UPDATE_CHAN[YM2612->CHANNEL[2].ALGO + algo_type](YM2612, &(YM2612->CHANNEL[2]), procbuf, proclen);
    if (!YM2612->CHANNEL[3].Mute)
      UPDATE_CHAN[YM2612->CHANNEL[3].ALGO + algo_type](YM2612, &(YM2612->CHANNEL[3]), procbuf, proclen);
    if (!YM2612->CHANNEL[4].Mute)
      UPDATE_CHAN[YM2612->CHANNEL[4].ALGO + algo_type](YM2612, &(YM2612->CHANNEL[4]), procbuf, proclen);
    if (!YM2612->CHANNEL[5].Mute && !(YM2612->DAC))
      UPDATE_CHAN[YM2612->CHANNEL[5].ALGO + algo_type](YM2612, &(YM2612->CHANNEL[5]), procbuf, proclen);

    procbuf[0] += proclen;
    procbuf[1] += proclen;
    length -= proclen;
  }

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nFinishing generating sound...\n\n");
#endif

}